

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void WindowSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (ctx->Windows).Size;
  if ((ulong)uVar1 != 0) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    do {
      if (uVar3 == uVar2) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      (ctx->Windows).Data[uVar2]->SettingsOffset = -1;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  ImChunkStream<ImGuiWindowSettings>::clear(&ctx->SettingsWindows);
  return;
}

Assistant:

static void WindowSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
        g.Windows[i]->SettingsOffset = -1;
    g.SettingsWindows.clear();
}